

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

int __thiscall
ki::dml::Field<signed_char>::clone
          (Field<signed_char> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Field<signed_char> *this_00;
  string local_38 [40];
  Field<signed_char> *clone;
  Field<signed_char> *this_local;
  
  clone = this;
  this_00 = (Field<signed_char> *)operator_new(0x40);
  std::__cxx11::string::string(local_38,(string *)&(this->super_FieldBase).m_name);
  Field(this_00,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  (this_00->super_FieldBase).m_transferable = (bool)((this->super_FieldBase).m_transferable & 1);
  this_00->m_value = this->m_value;
  return (int)this_00;
}

Assistant:

Field<ValueT> *clone() const override final
		{
			auto *clone = new Field<ValueT>(m_name);
			clone->m_transferable = m_transferable;
			clone->m_value = m_value;
			return clone;
		}